

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **args)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  char *pcVar4;
  string name;
  stringstream path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  char *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  if (argc < 2) {
    pcVar4 = "Usage: MP3Encoder <directory name>";
    sVar3 = 0x22;
  }
  else {
    pcVar4 = args[1];
    __dirp = opendir(pcVar4);
    if (__dirp != (DIR *)0x0) {
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_200 = pcVar4;
      while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        sVar3 = strlen(pdVar2->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,pdVar2->d_name,pdVar2->d_name + sVar3);
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_220,".");
        if ((iVar1 != 0) &&
           (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_220,".."), iVar1 != 0)) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          pcVar4 = local_200;
          if (local_200 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(local_1a8[0] + -0x18) + (int)(ostream *)local_1a8);
          }
          else {
            sVar3 = strlen(local_200);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8
                     ,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
      }
      closedir(__dirp);
      mp3_encoder::parallel_encoder::run(&local_1d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open directory ",0x19);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1071d0);
      goto LAB_001024dd;
    }
    sVar3 = strlen(pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar3);
LAB_001024dd:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return 1;
}

Assistant:

int main(int argc, char** args)
{
    if (argc < 2)
    {
        std::cerr << "Usage: MP3Encoder <directory name>" << std::endl;
        return 1;
    }

    auto const dirName = args[1];
    auto const dir = opendir(dirName);
    if (!dir)
    {
        std::cerr << "Failed to open directory " << dirName << std::endl;
        return 1;
    }

    auto paths = std::vector<std::string>{};

    for (dirent* dirent = nullptr; (dirent = readdir(dir)) != nullptr;)
    {
        auto const name = std::string{dirent->d_name};
        if ((name == ".") || (name == ".."))
        {
            continue;
        }

        auto path = std::stringstream{};
        path << dirName << "/" << name;

        paths.push_back(path.str());
    }

    closedir(dir);

    mp3_encoder::parallel_encoder::run(paths);

    return 0;
}